

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::GroupClassInfo::permute(GroupClassInfo *this,RecGroupInfo *info)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  BrandTypeIterator *this_00;
  HeapType HVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint uVar8;
  uint local_5c;
  Index i_1;
  uint local_50;
  Index i;
  allocator<wasm::HeapType> local_39;
  undefined1 local_38 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> canonical;
  bool insertingBrand;
  RecGroupInfo *info_local;
  GroupClassInfo *this_local;
  
  sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&info->group);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&info->permutation);
  if (sVar2 != sVar3) {
    __assert_fail("info.group.size() == info.permutation.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                  ,0x121,"void wasm::(anonymous namespace)::GroupClassInfo::permute(RecGroupInfo &)"
                 );
  }
  sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&info->group);
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(&this->subtypeGraph);
  canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = sVar2 < sVar3;
  sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&info->group);
  uVar8 = (uint)canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  std::allocator<wasm::HeapType>::allocator(&local_39);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,sVar2 + (uVar8 & 1)
             ,&local_39);
  std::allocator<wasm::HeapType>::~allocator(&local_39);
  for (local_50 = 0;
      sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&info->group),
      local_50 < sVar2; local_50 = local_50 + 1) {
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       (&info->group,(ulong)local_50);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&info->permutation,(ulong)local_50);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,
                        (ulong)(*pvVar5 +
                               (uint)(canonical.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1))
                       );
    pvVar6->id = pvVar4->id;
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->brand);
  if (bVar1) {
    this_00 = std::optional<wasm::(anonymous_namespace)::BrandTypeIterator>::operator*(&this->brand)
    ;
    HVar7 = BrandTypeIterator::operator*(this_00);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,0);
    pvVar4->id = HVar7.id;
  }
  if ((canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&info->group);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize(&info->group,sVar2 + 1);
    info->hasBrand = true;
  }
  __x = TopologicalOrdersImpl<std::monostate>::operator*(&this->orders);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&info->permutation,__x);
  for (local_5c = 0;
      sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&info->group),
      local_5c < sVar2; local_5c = local_5c + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&info->permutation,(ulong)local_5c);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,
                        (ulong)*pvVar5);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       (&info->group,(ulong)local_5c);
    pvVar6->id = pvVar4->id;
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38);
  return;
}

Assistant:

void GroupClassInfo::permute(RecGroupInfo& info) {
  assert(info.group.size() == info.permutation.size());
  bool insertingBrand = info.group.size() < subtypeGraph.size();
  // First, un-permute the group to get back to the canonical order, offset by 1
  // if we are newly inserting a brand.
  std::vector<HeapType> canonical(info.group.size() + insertingBrand);
  for (Index i = 0; i < info.group.size(); ++i) {
    canonical[info.permutation[i] + insertingBrand] = info.group[i];
  }
  // Update the brand.
  if (brand) {
    canonical[0] = **brand;
  }
  if (insertingBrand) {
    info.group.resize(info.group.size() + 1);
    info.hasBrand = true;
  }
  // Finally, re-permute with the new permutation..
  info.permutation = *orders;
  for (Index i = 0; i < info.group.size(); ++i) {
    info.group[i] = canonical[info.permutation[i]];
  }
}